

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_style.c
# Opt level: O1

int main(int argc,char **argv)

{
  GLfloat *pGVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  float fVar5;
  int iVar6;
  bov_window_t *window;
  bov_text_t *text;
  bov_text_t *text_00;
  bov_text_t *text_01;
  bov_text_t *text_02;
  bov_text_t *text_03;
  bov_text_t *text_04;
  GLubyte local_108 [16];
  GLubyte local_f8 [16];
  GLubyte local_e8 [32];
  GLubyte local_c8 [32];
  GLubyte local_a8 [120];
  
  window = bov_window_new(0,0,*argv);
  window->backgroundColor[0] = 0.8;
  window->backgroundColor[1] = 0.8;
  window->backgroundColor[2] = 0.8;
  window->backgroundColor[3] = 1.0;
  builtin_memcpy(local_c8,"varying outline width",0x16);
  text = bov_text_new(local_c8,0x88e4);
  (text->param).fillColor[0] = 0.0;
  (text->param).fillColor[1] = 0.0;
  (text->param).fillColor[2] = 0.0;
  (text->param).fillColor[3] = 0.0;
  (text->param).outlineColor[0] = 1.0;
  (text->param).outlineColor[1] = 0.0;
  (text->param).outlineColor[2] = 0.0;
  (text->param).outlineColor[3] = 2.0;
  (text->param).pos[0] = -1.0;
  (text->param).pos[1] = 0.66;
  (text->param).shift[0] = 0.0;
  (text->param).shift[1] = 0.0;
  (text->param).fontSize = 0.25;
  (text->param).boldness = 0.25;
  (text->param).outlineWidth = 0.5;
  (text->param).spaceType = USUAL_SPACE;
  builtin_memcpy(local_f8 + 8,"width",6);
  builtin_memcpy(local_f8,"varying ",8);
  text_00 = bov_text_new(local_f8,0x88e4);
  (text_00->param).fontSize = 0.25;
  (text_00->param).boldness = 0.25;
  (text_00->param).outlineWidth = 0.5;
  (text_00->param).spaceType = USUAL_SPACE;
  (text_00->param).pos[0] = -1.0;
  (text_00->param).pos[1] = 0.66;
  (text_00->param).shift[0] = 0.0;
  (text_00->param).shift[1] = 0.0;
  (text_00->param).outlineColor[0] = 1.0;
  (text_00->param).outlineColor[1] = 0.0;
  (text_00->param).outlineColor[2] = 0.0;
  (text_00->param).outlineColor[3] = 2.0;
  (text_00->param).outlineWidth = -1.0;
  (text_00->param).fillColor[0] = 0.2;
  (text_00->param).fillColor[1] = 0.2;
  (text_00->param).fillColor[2] = 0.2;
  (text_00->param).fillColor[3] = 1.0;
  (text_00->param).pos[0] = -1.0;
  (text_00->param).pos[1] = 0.33;
  builtin_memcpy(local_e8 + 0x10,"shift",6);
  builtin_memcpy(local_e8,"varying outline ",0x10);
  text_01 = bov_text_new(local_e8,0x88e4);
  (text_01->param).pos[0] = -1.0;
  (text_01->param).pos[1] = 0.66;
  (text_01->param).shift[0] = 0.0;
  (text_01->param).shift[1] = 0.0;
  (text_01->param).fillColor[0] = 0.0;
  (text_01->param).fillColor[1] = 0.0;
  (text_01->param).fillColor[2] = 0.0;
  (text_01->param).fillColor[3] = 0.0;
  (text_01->param).outlineColor[0] = 1.0;
  (text_01->param).outlineColor[1] = 0.0;
  (text_01->param).outlineColor[2] = 0.0;
  (text_01->param).outlineColor[3] = 2.0;
  (text_01->param).fontSize = 0.25;
  (text_01->param).boldness = 0.25;
  (text_01->param).outlineWidth = 0.5;
  (text_01->param).spaceType = USUAL_SPACE;
  (text_01->param).pos[0] = -1.0;
  (text_01->param).pos[1] = 0.0;
  builtin_memcpy(local_108,"varying size",0xd);
  text_02 = bov_text_new(local_108,0x88e4);
  (text_02->param).pos[0] = -1.0;
  (text_02->param).pos[1] = 0.66;
  (text_02->param).shift[0] = 0.0;
  (text_02->param).shift[1] = 0.0;
  (text_02->param).fillColor[0] = 0.0;
  (text_02->param).fillColor[1] = 0.0;
  (text_02->param).fillColor[2] = 0.0;
  (text_02->param).fillColor[3] = 0.0;
  (text_02->param).outlineColor[0] = 1.0;
  (text_02->param).outlineColor[1] = 0.0;
  (text_02->param).outlineColor[2] = 0.0;
  (text_02->param).outlineColor[3] = 2.0;
  (text_02->param).fontSize = 0.25;
  (text_02->param).boldness = 0.25;
  (text_02->param).outlineWidth = 0.5;
  (text_02->param).spaceType = USUAL_SPACE;
  (text_02->param).pos[0] = -1.0;
  (text_02->param).pos[1] = -0.33;
  memcpy(local_a8 + 0x1e,
         "This text is unmoovable and unzoomable. Its position and its size must be given in pixels"
         ,0x5a);
  text_03 = bov_text_new(local_a8 + 0x1e,0x88e4);
  if ((text_03->param).spaceType != PIXEL_SPACE) {
    pGVar1 = (text_03->param).pos;
    if (*pGVar1 <= 5.0 && *pGVar1 != 5.0) {
      (text_03->param).pos[0] = 5.0;
    }
    pGVar1 = (text_03->param).pos + 1;
    if (*pGVar1 <= 5.0 && *pGVar1 != 5.0) {
      (text_03->param).pos[1] = 5.0;
    }
    pGVar1 = &(text_03->param).fontSize;
    if (*pGVar1 <= 32.0 && *pGVar1 != 32.0) {
      (text_03->param).fontSize = 32.0;
    }
  }
  (text_03->param).spaceType = PIXEL_SPACE;
  builtin_memcpy(local_a8 + 0x10,"on this point",0xe);
  builtin_memcpy(local_a8,".you can\'t zoom ",0x10);
  text_04 = bov_text_new(local_a8,0x88e4);
  fVar5 = (2.0 / (window->param).res[1]) * 64.0;
  (text_04->param).pos[0] = -1.0;
  (text_04->param).pos[1] = fVar5 * -1.1 + 1.0;
  (text_04->param).fontSize = fVar5;
  (text_04->param).spaceType = UNZOOMABLE_SPACE;
  while( true ) {
    iVar6 = glfwWindowShouldClose(window->self);
    if (iVar6 != 0) break;
    dVar2 = window->wtime;
    dVar3 = sin(dVar2);
    (text->param).outlineWidth = (float)(dVar3 * 0.6 + 0.6);
    bov_text_draw(window,text);
    dVar3 = sin(dVar2);
    (text_00->param).boldness = (float)(dVar3 * 0.5 + -0.1);
    bov_text_draw(window,text_00);
    dVar3 = sin(dVar2 * 3.0);
    dVar4 = cos(dVar2 * 3.0);
    (text_01->param).shift[0] = (float)dVar3;
    (text_01->param).shift[1] = (float)dVar4;
    bov_text_draw(window,text_01);
    dVar2 = sin(dVar2);
    (text_02->param).fontSize = (float)(dVar2 * 0.1 + 0.1);
    bov_text_draw(window,text_02);
    bov_text_draw(window,text_03);
    bov_text_draw(window,text_04);
    bov_window_update(window);
  }
  puts("Ended correctly");
  bov_text_delete(text);
  bov_text_delete(text_00);
  bov_text_delete(text_01);
  bov_window_delete(window);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	bov_window_t* window = bov_window_new(0, 0, argv[0]);
	bov_window_set_color(window, (GLfloat[4]) {0.8, 0.8, 0.8, 1.0});


	bov_text_t* outline = bov_text_new(
		(GLubyte[]) {"varying outline width"},
		GL_STATIC_DRAW);

	// putting more than 1 on the alpha component for radiation effect
	bov_text_param_t parameters = {
		.outlineColor = {1.0, 0.0, 0.0, 2.0},
		.pos = {-1.0, 0.66},
		.fillColor = {0},// completely transparent
		.fontSize = 0.25,
		.boldness = 0.25,
		.outlineWidth = 0.5
	};
	bov_text_set_param(outline, parameters);


	bov_text_t* width = bov_text_new(
		(GLubyte[]) {"varying width"},
		GL_STATIC_DRAW);
	bov_text_set_param(width, parameters);
	bov_text_set_outline_width(width, -1.0);
	bov_text_set_color(width, (GLfloat[4]) {0.2, 0.2, 0.2, 1});
	bov_text_set_pos(width, (GLfloat[2]) {-1.0, 0.33});


	bov_text_t* shift = bov_text_new(
		(GLubyte[]) {"varying outline shift"},
		GL_STATIC_DRAW);
	bov_text_set_param(shift, parameters);
	bov_text_set_pos(shift, (GLfloat[2]) {-1.0, 0.0});

	bov_text_t* fontSize = bov_text_new(
		(GLubyte[]) {"varying size"},
		GL_STATIC_DRAW);
	bov_text_set_param(fontSize, parameters);
	bov_text_set_pos(fontSize, (GLfloat[2]) {-1.0, -0.33});



	bov_text_t* pixel = bov_text_new(
		(GLubyte[]) {"This text is unmoovable and unzoomable."
		             " Its position and its size"
		             " must be given in pixels"},
		GL_STATIC_DRAW);
	bov_text_set_space_type(pixel, PIXEL_SPACE);


	bov_text_t* unzoomable = bov_text_new(
		(GLubyte[]) {".you can't zoom on this point"},
		GL_STATIC_DRAW);
	GLfloat pixel64 = 2.0 / bov_window_get_yres(window) * 64.0; //~64 pixels height
	bov_text_set_pos(unzoomable, (GLfloat[2]) {-1.0, 1 - 1.1 * pixel64});
	bov_text_set_fontsize(unzoomable, pixel64);
	bov_text_set_space_type(unzoomable, UNZOOMABLE_SPACE);



	while(!bov_window_should_close(window)) {
		double wtime = bov_window_get_time(window);

		bov_text_set_outline_width(outline, 0.6 * sin(wtime) + 0.6);
		bov_text_draw(window, outline);

		bov_text_set_boldness(width, 0.5 * sin(wtime) - 0.1);
		bov_text_draw(window, width);

		bov_text_set_outline_shift(shift, (GLfloat[2]){
		                                sin(3 * wtime),
		                                cos(3 * wtime)});
		bov_text_draw(window, shift);

		bov_text_set_fontsize(fontSize, 0.1 * sin(wtime) + 0.1);
		bov_text_draw(window, fontSize);

		bov_text_draw(window, pixel);
		bov_text_draw(window, unzoomable);

		bov_window_update(window);
	}

	printf("Ended correctly\n");

	bov_text_delete(outline);
	bov_text_delete(width);
	bov_text_delete(shift);

	bov_window_delete(window);

	return EXIT_SUCCESS;
}